

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Souperify.cpp
# Opt level: O3

void __thiscall wasm::DataFlow::Printer::print(Printer *this,Node *node)

{
  pointer ppNVar1;
  pointer ppNVar2;
  Node *this_00;
  int iVar3;
  iterator iVar4;
  ostream *poVar5;
  Type type;
  const_iterator cVar6;
  key_type *ppNVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  Node *local_48;
  Node *block;
  char local_31;
  
  local_48 = node;
  iVar4 = std::
          _Hashtable<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->trace->replacements)._M_h,&local_48);
  ppNVar7 = (key_type *)
            ((long)iVar4.
                   super__Node_iterator_base<std::pair<wasm::DataFlow::Node_*const,_std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>,_false>
                   ._M_cur + 0x10);
  if (iVar4.
      super__Node_iterator_base<std::pair<wasm::DataFlow::Node_*const,_std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    ppNVar7 = &local_48;
  }
  block = *ppNVar7;
  if (block == (key_type)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Souperify.cpp"
                  ,0x1c9,"void wasm::DataFlow::Printer::print(Node *)");
  }
  switch(block->type) {
  case Var:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"%",1);
    std::__detail::
    _Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
    ::operator[]((_Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&this->indexing,&block);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
    poVar5 = wasm::operator<<(poVar5,(Type)(block->field_1).wasmType.id);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," = var",6);
    goto LAB_00b3d48c;
  case Expr:
    iVar3 = debug();
    if (iVar3 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"; ",2);
      poVar5 = std::operator<<((ostream *)&std::cout,(block->field_1).expr);
      local_48 = (Node *)CONCAT71(local_48._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_48,1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"%",1);
    std::__detail::
    _Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
    ::operator[]((_Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&this->indexing,&block);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
    printExpression(this,block);
    goto LAB_00b3d48c;
  case Phi:
    ppNVar2 = (block->values).
              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((block->values).
        super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppNVar2) {
      local_48 = *ppNVar2;
      ppNVar2 = (local_48->values).
                super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      ppNVar1 = (local_48->values).
                super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar10 = 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"%",1);
      std::__detail::
      _Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
      ::operator[]((_Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)&this->indexing,&block);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," = phi %",8);
      std::__detail::
      _Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
      ::operator[]((_Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)&this->indexing,&local_48);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      uVar11 = ((long)ppNVar2 - (long)ppNVar1 >> 3) + 1;
      if (1 < uVar11) {
        uVar9 = 2;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
          ppNVar2 = (block->values).
                    super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar8 = (long)(block->values).
                        super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar2 >> 3;
          if (uVar8 <= uVar10) goto LAB_00b3d52b;
          printInternal(this,ppNVar2[uVar10]);
          uVar10 = (ulong)uVar9;
          uVar9 = uVar9 + 1;
        } while (uVar10 < uVar11);
      }
      goto LAB_00b3d48c;
    }
    break;
  case Cond:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"blockpc %",9);
    ppNVar2 = (block->values).
              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((block->values).
        super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppNVar2) {
      local_48 = *ppNVar2;
      std::__detail::
      _Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
      ::operator[]((_Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)&this->indexing,&local_48);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      local_31 = ' ';
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_31,1);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      local_31 = ' ';
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_31,1);
      ppNVar2 = (block->values).
                super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar8 = (long)(block->values).
                    super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar2 >> 3;
      if (1 < uVar8) {
        printInternal(this,ppNVar2[1]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," 1:i1",5);
        goto LAB_00b3d48c;
      }
      uVar10 = 1;
      goto LAB_00b3d52b;
    }
    break;
  case Block:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"%",1);
    std::__detail::
    _Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
    ::operator[]((_Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&this->indexing,&block);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," = block ",9);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
LAB_00b3d48c:
    if (((block->type - Expr < 2) && (block->origin != this->trace->toInfer->origin)) &&
       (cVar6 = std::
                _Hashtable<wasm::DataFlow::Node_*,_wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>,_std::__detail::_Identity,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find(&(this->trace->hasExternalUses)._M_h,&block),
       cVar6.super__Node_iterator_base<wasm::DataFlow::Node_*,_false>._M_cur != (__node_type *)0x0))
    {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," (hasExternalUses)",0x12);
      this->printedHasExternalUses = true;
    }
    local_48 = (Node *)CONCAT71(local_48._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_48,1);
    iVar3 = debug();
    if ((iVar3 != 0) && (block->type - Expr < 2)) {
      warnOnSuspiciousValues(this,block);
    }
    return;
  case Zext:
    ppNVar2 = (block->values).
              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((block->values).
        super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppNVar2) {
      this_00 = *ppNVar2;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"%",1);
      std::__detail::
      _Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
      ::operator[]((_Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)&this->indexing,&block);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      local_48 = (Node *)CONCAT71(local_48._1_7_,0x3a);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_48,1);
      type = Node::getWasmType(this_00);
      wasm::operator<<(poVar5,type);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," = zext ",8);
      printInternal(this,this_00);
      goto LAB_00b3d48c;
    }
    break;
  case Bad:
    handle_unreachable("!!!BAD!!!",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Souperify.cpp"
                       ,0x1f6);
  default:
    handle_unreachable("unexpted type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Souperify.cpp"
                       ,0x1f9);
  }
  uVar10 = 0;
  uVar8 = 0;
LAB_00b3d52b:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar10,
             uVar8);
}

Assistant:

void print(Node* node) {
    // The node may have been replaced during trace building, if so then
    // print the proper replacement.
    node = getMaybeReplaced(node);
    assert(node);
    switch (node->type) {
      case Node::Type::Var: {
        std::cout << "%" << indexing[node] << ":" << node->wasmType << " = var";
        break; // nothing more to add
      }
      case Node::Type::Expr: {
        if (debug()) {
          std::cout << "; ";
          std::cout << *node->expr << '\n';
        }
        std::cout << "%" << indexing[node] << " = ";
        printExpression(node);
        break;
      }
      case Node::Type::Phi: {
        auto* block = node->getValue(0);
        auto size = block->values.size();
        std::cout << "%" << indexing[node] << " = phi %" << indexing[block];
        for (Index i = 1; i < size + 1; i++) {
          std::cout << ", ";
          printInternal(node->getValue(i));
        }
        break;
      }
      case Node::Type::Cond: {
        std::cout << "blockpc %" << indexing[node->getValue(0)] << ' '
                  << node->index << ' ';
        printInternal(node->getValue(1));
        std::cout << " 1:i1";
        break;
      }
      case Node::Type::Block: {
        std::cout << "%" << indexing[node] << " = block "
                  << node->values.size();
        break;
      }
      case Node::Type::Zext: {
        auto* child = node->getValue(0);
        std::cout << "%" << indexing[node] << ':' << child->getWasmType();
        std::cout << " = zext ";
        printInternal(child);
        break;
      }
      case Node::Type::Bad: {
        WASM_UNREACHABLE("!!!BAD!!!");
      }
      default:
        WASM_UNREACHABLE("unexpted type");
    }
    if (node->isExpr() || node->isPhi()) {
      if (node->origin != trace.toInfer->origin &&
          trace.hasExternalUses.count(node) > 0) {
        std::cout << " (hasExternalUses)";
        printedHasExternalUses = true;
      }
    }
    std::cout << '\n';
    if (debug() && (node->isExpr() || node->isPhi())) {
      warnOnSuspiciousValues(node);
    }
  }